

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_value_tmp_tests.hpp
# Opt level: O2

string * __thiscall
iutest::tr1::
ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
::MakeTestSuiteName_abi_cxx11_
          (string *__return_storage_ptr__,
          ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,iutest::detail::VariadicTypeList<iutest::TemplateValue<10l>,iutest::TemplateValue<0l>>>
          *this,char *testsuite,size_t index)

{
  iu_stringstream strm;
  string asStack_1b8 [32];
  allocator<char> local_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,local_198);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string MakeTestSuiteName(const char* testsuite, size_t index)
    {
        ::std::string name = testsuite;
        iu_stringstream strm; strm << index;
        name += "/";
        name += strm.str();
        return name;
    }